

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O1

void setvalue(context *ctx,lua_State *L,int index,node *n)

{
  table *ptVar1;
  int iVar2;
  char *pcVar3;
  lua_Number lVar4;
  table *ptVar5;
  undefined4 in_register_00000014;
  lua_Number *plVar6;
  size_t sz;
  size_t local_30;
  
  plVar6 = (lua_Number *)CONCAT44(in_register_00000014,index);
  iVar2 = lua_type(L,-1);
  switch(iVar2) {
  case 0:
    *(undefined1 *)((long)plVar6 + 0x15) = 0;
    break;
  case 1:
    iVar2 = lua_toboolean(L,-1);
    *(int *)plVar6 = iVar2;
    *(undefined1 *)((long)plVar6 + 0x15) = 3;
    break;
  default:
    pcVar3 = lua_typename(L,iVar2);
    luaL_error(L,"Unsupport value type %s",pcVar3);
    return;
  case 3:
    iVar2 = lua_isinteger(L,-1);
    if (iVar2 == 0) {
      lVar4 = lua_tonumberx(L,-1,(int *)0x0);
      *plVar6 = lVar4;
      *(undefined1 *)((long)plVar6 + 0x15) = 1;
    }
    else {
      lVar4 = (lua_Number)lua_tointegerx(L,-1,(int *)0x0);
      *plVar6 = lVar4;
      *(undefined1 *)((long)plVar6 + 0x15) = 5;
    }
    break;
  case 4:
    local_30 = 0;
    pcVar3 = lua_tolstring(L,-1,&local_30);
    iVar2 = stringindex(ctx,pcVar3,local_30);
    *(int *)plVar6 = iVar2;
    *(undefined1 *)((long)plVar6 + 0x15) = 2;
    break;
  case 5:
    ptVar1 = ctx->tbl;
    ptVar5 = (table *)malloc(0x28);
    ctx->tbl = ptVar5;
    if (ptVar5 == (table *)0x0) {
      ctx->tbl = ptVar1;
      luaL_error(L,"memory error");
    }
    ptVar5 = ctx->tbl;
    ptVar5->array = (value *)0x0;
    ptVar5->hash = (node *)0x0;
    ptVar5->sizearray = 0;
    ptVar5->sizehash = 0;
    ptVar5->arraytype = (uint8_t *)0x0;
    ptVar5->L = (lua_State *)0x0;
    iVar2 = lua_absindex(L,-1);
    lua_pushcclosure(L,convtable,0);
    lua_pushvalue(L,iVar2);
    lua_pushlightuserdata(L,ctx);
    lua_callk(L,2,0,0,(lua_KFunction)0x0);
    *plVar6 = (lua_Number)ctx->tbl;
    *(undefined1 *)((long)plVar6 + 0x15) = 4;
    ctx->tbl = ptVar1;
  }
  return;
}

Assistant:

static void
setvalue(struct context * ctx, lua_State *L, int index, struct node *n) {
	int vt = lua_type(L, index);
	switch(vt) {
	case LUA_TNIL:
		n->valuetype = VALUETYPE_NIL;
		break;
	case LUA_TNUMBER:
		if (lua_isinteger(L, index)) {
			n->v.d = lua_tointeger(L, index);
			n->valuetype = VALUETYPE_INTEGER;
		} else {
			n->v.n = lua_tonumber(L, index);
			n->valuetype = VALUETYPE_REAL;
		}
		break;
	case LUA_TSTRING: {
		size_t sz = 0;
		const char * str = lua_tolstring(L, index, &sz);
		n->v.string = stringindex(ctx, str, sz);
		n->valuetype = VALUETYPE_STRING;
		break;
	}
	case LUA_TBOOLEAN:
		n->v.boolean = lua_toboolean(L, index);
		n->valuetype = VALUETYPE_BOOLEAN;
		break;
	case LUA_TTABLE: {
		struct table *tbl = ctx->tbl;
		ctx->tbl = (struct table *)malloc(sizeof(struct table));
		if (ctx->tbl == NULL) {
			ctx->tbl = tbl;
			luaL_error(L, "memory error");
			// never get here
		}
		memset(ctx->tbl, 0, sizeof(struct table));
		int absidx = lua_absindex(L, index);

		lua_pushcfunction(L, convtable);
		lua_pushvalue(L, absidx);
		lua_pushlightuserdata(L, ctx);

		lua_call(L, 2, 0);

		n->v.tbl = ctx->tbl;
		n->valuetype = VALUETYPE_TABLE;

		ctx->tbl = tbl;

		break;
	}
	default:
		luaL_error(L, "Unsupport value type %s", lua_typename(L, vt));
		break;
	}
}